

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool AdditionHelper<unsigned_long,_unsigned_char,_3>::Addition
               (unsigned_long *lhs,uchar *rhs,unsigned_long *result)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t tmp;
  unsigned_long *result_local;
  uchar *rhs_local;
  unsigned_long *lhs_local;
  
  uVar2 = *lhs + (ulong)*rhs;
  uVar1 = *lhs;
  if (uVar1 <= uVar2) {
    *result = uVar2;
  }
  return uVar1 <= uVar2;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs std::uint64_t, rhs unsigned
        std::uint64_t tmp = (std::uint64_t)lhs + (std::uint64_t)rhs;

        // We added and it didn't get smaller
        if(tmp >= lhs)
        {
            result = (T)tmp;
            return true;
        }

        return false;
    }